

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem.cpp
# Opt level: O2

Error __thiscall asmjit::VMemMgr::release(VMemMgr *this,void *p)

{
  uint8_t *puVar1;
  size_t sVar2;
  size_t sVar3;
  uint8_t *puVar4;
  MemNode *pMVar5;
  RbNode *pRVar6;
  MemNode *pMVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  size_t *psVar10;
  MemNode *pMVar11;
  ulong uVar12;
  MemNode *pMVar13;
  ulong uVar14;
  ulong uVar15;
  MemNode *pMVar16;
  MemNode *pMVar17;
  long lVar18;
  Error EVar19;
  ulong uVar20;
  ulong *puVar21;
  MemNode *__ptr;
  MemNode **ppMVar22;
  bool bVar23;
  ulong *puVar24;
  MemNode **ppMVar25;
  byte bVar26;
  RbNode *save_1;
  ulong uVar27;
  RbNode *pRVar28;
  RbNode *save;
  MemNode *pMVar29;
  RbNode *pRVar30;
  bool bVar31;
  bool bVar32;
  RbNode *local_58;
  MemNode *pMStack_50;
  uint8_t *local_48;
  uint32_t uStack_40;
  undefined4 uStack_3c;
  
  if (p == (void *)0x0) {
    return 0;
  }
  pthread_mutex_lock((pthread_mutex_t *)this);
  pMVar11 = vMemMgrFindNodeByPtr(this,(uint8_t *)p);
  if (pMVar11 != (MemNode *)0x0) {
    puVar1 = (pMVar11->super_RbNode).mem;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = pMVar11->density;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (long)p - (long)puVar1;
    lVar18 = 0;
    uVar20 = SUB168(auVar9 / auVar8,0) >> 3 & 0xfffffffffffffff8;
    puVar24 = (ulong *)((long)pMVar11->baUsed + uVar20);
    puVar21 = (ulong *)(uVar20 + (long)pMVar11->baCont);
    uVar20 = 1L << (SUB161(auVar9 / auVar8,0) & 0x3f);
    do {
      uVar12 = *puVar24;
      uVar15 = *puVar21;
      do {
        uVar27 = uVar20;
        uVar14 = uVar15;
        uVar12 = uVar12 & ~uVar27;
        uVar15 = ~uVar27 & uVar14;
        lVar18 = lVar18 + 1;
        if ((uVar27 & uVar14) == 0) break;
        uVar20 = uVar27 * 2;
      } while (uVar27 * 2 != 0);
      *puVar24 = uVar12;
      *puVar21 = uVar15;
      if ((uVar27 & uVar14) == 0) goto LAB_001126c9;
      puVar24 = puVar24 + 1;
      puVar21 = puVar21 + 1;
      uVar20 = 1;
    } while( true );
  }
  EVar19 = 3;
  goto LAB_001129a3;
LAB_001126c9:
  sVar2 = pMVar11->size;
  sVar3 = pMVar11->used;
  if (sVar3 == sVar2) {
    pMVar16 = this->_optimal;
    do {
      pMVar16 = pMVar16->prev;
      if (pMVar16 == pMVar11) {
        this->_optimal = pMVar11;
        break;
      }
    } while (pMVar16 != (MemNode *)0x0);
  }
  uVar20 = lVar18 * pMVar11->density;
  if (pMVar11->largestBlock < uVar20) {
    pMVar11->largestBlock = uVar20;
  }
  pMVar11->used = sVar3 - uVar20;
  this->_usedBytes = this->_usedBytes - uVar20;
  if (sVar3 == uVar20) {
    OSUtils::releaseVirtualMemory(puVar1,sVar2);
    free(pMVar11->baUsed);
    pMVar11->baUsed = (size_t *)0x0;
    pMVar11->baCont = (size_t *)0x0;
    this->_allocatedBytes = this->_allocatedBytes - pMVar11->size;
    local_48 = (uint8_t *)0x0;
    uStack_40 = 0;
    uStack_3c = 0;
    local_58 = (RbNode *)0x0;
    pMStack_50 = this->_root;
    pMVar13 = (MemNode *)0x0;
    pMVar16 = (MemNode *)&stack0xffffffffffffffa8;
    __ptr = (MemNode *)0x0;
    bVar31 = true;
LAB_0011275d:
    bVar23 = bVar31;
    pMVar29 = __ptr;
    __ptr = pMVar16;
    pMVar16 = (MemNode *)(__ptr->super_RbNode).node[bVar23];
    if (pMVar16 != (MemNode *)0x0) {
      puVar1 = (pMVar16->super_RbNode).mem;
      puVar4 = (pMVar11->super_RbNode).mem;
      bVar31 = puVar1 < puVar4;
      if (pMVar16 == pMVar11) {
        pMVar13 = pMVar16;
      }
      if ((pMVar16->super_RbNode).red == 0) {
        bVar32 = puVar1 < puVar4;
        pRVar28 = (pMVar16->super_RbNode).node[bVar32];
        if ((pRVar28 == (RbNode *)0x0) || (pRVar28->red == 0)) {
          pMVar5 = (MemNode *)(pMVar16->super_RbNode).node[puVar4 <= puVar1];
          if ((pMVar5 != (MemNode *)0x0) && ((pMVar5->super_RbNode).red != 0)) {
            (pMVar16->super_RbNode).node[puVar4 <= puVar1] = (pMVar5->super_RbNode).node[bVar32];
            (pMVar5->super_RbNode).node[bVar32] = (RbNode *)pMVar16;
            (pMVar16->super_RbNode).red = 1;
            (pMVar5->super_RbNode).red = 0;
            (__ptr->super_RbNode).node[bVar23] = (RbNode *)pMVar5;
            __ptr = pMVar5;
            goto LAB_0011275d;
          }
          bVar26 = bVar23 ^ 1;
          pRVar28 = (__ptr->super_RbNode).node[bVar26];
          if (pRVar28 != (RbNode *)0x0) {
            if ((pRVar28->node[bVar26] == (RbNode *)0x0) || (pRVar28->node[bVar26]->red == 0)) {
              pRVar30 = pRVar28->node[bVar23];
              if ((pRVar30 == (RbNode *)0x0) || (pRVar30->red == 0)) {
                (__ptr->super_RbNode).red = 0;
                pRVar28->red = 1;
                (pMVar16->super_RbNode).red = 1;
                goto LAB_0011275d;
              }
              uVar20 = (ulong)((MemNode *)(pMVar29->super_RbNode).node[1] == __ptr);
LAB_0011285a:
              pRVar28->node[bVar23] = pRVar30->node[bVar26];
              pRVar30->node[bVar26] = pRVar28;
              pRVar28->red = 1;
              (__ptr->super_RbNode).node[bVar26] = pRVar30;
              (__ptr->super_RbNode).node[bVar26] = pRVar30->node[bVar23];
              pRVar30->node[bVar23] = &__ptr->super_RbNode;
              (__ptr->super_RbNode).red = 1;
              pRVar28 = pRVar30;
            }
            else {
              pRVar30 = pRVar28->node[bVar23];
              uVar20 = (ulong)((MemNode *)(pMVar29->super_RbNode).node[1] == __ptr);
              if ((pRVar30 != (RbNode *)0x0) && (pRVar30->red != 0)) goto LAB_0011285a;
              (__ptr->super_RbNode).node[bVar26] = pRVar30;
              pRVar28->node[bVar23] = &__ptr->super_RbNode;
              (__ptr->super_RbNode).red = 1;
            }
            pRVar28->red = 0;
            (pMVar29->super_RbNode).node[uVar20] = pRVar28;
            pRVar30 = pRVar28->node[0];
            pRVar6 = pRVar28->node[1];
            pRVar28->red = 1;
            (pMVar16->super_RbNode).red = 1;
            pRVar30->red = 0;
            pRVar6->red = 0;
          }
        }
      }
      goto LAB_0011275d;
    }
    if (pMVar13 == (MemNode *)0x0) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/base/vmem.cpp"
                 ,0x1cb,"f != nullptr");
    }
    if (pMVar13 == (MemNode *)&stack0xffffffffffffffa8) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/base/vmem.cpp"
                 ,0x1cc,"f != &head");
    }
    if (__ptr == (MemNode *)&stack0xffffffffffffffa8) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/base/vmem.cpp"
                 ,0x1cd,"q != &head");
    }
    if (pMVar13 != __ptr) {
      (pMVar13->super_RbNode).mem = (__ptr->super_RbNode).mem;
      sVar2 = __ptr->used;
      pMVar13->size = __ptr->size;
      pMVar13->used = sVar2;
      sVar2 = __ptr->density;
      pMVar13->blocks = __ptr->blocks;
      pMVar13->density = sVar2;
      pMVar13->largestBlock = __ptr->largestBlock;
      psVar10 = __ptr->baCont;
      pMVar13->baUsed = __ptr->baUsed;
      pMVar13->baCont = psVar10;
    }
    (pMVar29->super_RbNode).node[(MemNode *)(pMVar29->super_RbNode).node[1] == __ptr] =
         (__ptr->super_RbNode).node[(__ptr->super_RbNode).node[0] == (RbNode *)0x0];
    this->_root = pMStack_50;
    if (pMStack_50 != (MemNode *)0x0) {
      (pMStack_50->super_RbNode).red = 0;
    }
    pMVar7 = __ptr->prev;
    pMVar17 = __ptr->next;
    ppMVar22 = &pMVar7->next;
    if (pMVar7 == (MemNode *)0x0) {
      ppMVar22 = &this->_first;
    }
    ppMVar25 = &pMVar17->prev;
    if (pMVar17 == (MemNode *)0x0) {
      ppMVar25 = &this->_last;
    }
    *ppMVar22 = pMVar17;
    *ppMVar25 = pMVar7;
    if (this->_optimal == __ptr) {
      if (pMVar7 != (MemNode *)0x0) {
        pMVar17 = pMVar7;
      }
      this->_optimal = pMVar17;
    }
    free(__ptr);
    bVar31 = vMemMgrCheckTree(this);
    if (!bVar31) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/base/vmem.cpp"
                 ,0x358,"vMemMgrCheckTree(this)");
    }
  }
  EVar19 = 0;
LAB_001129a3:
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return EVar19;
}

Assistant:

Error VMemMgr::release(void* p) noexcept {
  if (!p) return kErrorOk;

  AutoLock locked(_lock);
  MemNode* node = vMemMgrFindNodeByPtr(this, static_cast<uint8_t*>(p));
  if (!node) return DebugUtils::errored(kErrorInvalidArgument);

  size_t offset = (size_t)((uint8_t*)p - (uint8_t*)node->mem);
  size_t bitpos = M_DIV(offset, node->density);
  size_t i = (bitpos / kBitsPerEntity);

  size_t* up = node->baUsed + i;  // Current ubits address.
  size_t* cp = node->baCont + i;  // Current cbits address.
  size_t ubits = *up;             // Current ubits[0] value.
  size_t cbits = *cp;             // Current cbits[0] value.
  size_t bit = (size_t)1 << (bitpos % kBitsPerEntity);

  size_t cont = 0;
  bool stop;

  for (;;) {
    stop = (cbits & bit) == 0;
    ubits &= ~bit;
    cbits &= ~bit;

    bit <<= 1;
    cont++;

    if (stop || bit == 0) {
      *up = ubits;
      *cp = cbits;
      if (stop)
        break;

      ubits = *++up;
      cbits = *++cp;
      bit = 1;
    }
  }

  // If the freed block is fully allocated node then it's needed to
  // update 'optimal' pointer in memory manager.
  if (node->used == node->size) {
    MemNode* cur = _optimal;

    do {
      cur = cur->prev;
      if (cur == node) {
        _optimal = node;
        break;
      }
    } while (cur);
  }

  // Statistics.
  cont *= node->density;
  if (node->largestBlock < cont)
    node->largestBlock = cont;

  node->used -= cont;
  _usedBytes -= cont;

  // If page is empty, we can free it.
  if (node->used == 0) {
    // Free memory associated with node (this memory is not accessed
    // anymore so it's safe).
    vMemMgrReleaseVMem(this, node->mem, node->size);
    Internal::releaseMemory(node->baUsed);

    node->baUsed = nullptr;
    node->baCont = nullptr;

    // Statistics.
    _allocatedBytes -= node->size;

    // Remove node. This function can return different node than
    // passed into, but data is copied into previous node if needed.
    Internal::releaseMemory(vMemMgrRemoveNode(this, node));
    ASMJIT_ASSERT(vMemMgrCheckTree(this));
  }

  return kErrorOk;
}